

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems(QGraphicsSceneBspTreeIndexPrivate *this)

{
  QList<int> *this_00;
  Data *pDVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->purgePending != false) ||
     ((pDVar1 = (this->removedItems).q_hash.d, pDVar1 != (Data *)0x0 && (pDVar1->size != 0)))) {
    QGraphicsSceneBspTree::removeItems(&this->bsp,&this->removedItems);
    QHash<QGraphicsItem_*,_QHashDummyValue>::clear(&(this->removedItems).q_hash);
    this_00 = &this->freeItemIndexes;
    QList<int>::clear(this_00);
    uVar2 = (this->indexedItems).d.size;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        if ((this->indexedItems).d.ptr[uVar3] == (QGraphicsItem *)0x0) {
          local_2c = (int)uVar3;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)this_00,(this->freeItemIndexes).d.size,&local_2c);
          QList<int>::end(this_00);
          uVar2 = (this->indexedItems).d.size;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    this->purgePending = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::purgeRemovedItems()
{
    if (!purgePending && removedItems.isEmpty())
        return;

    // Remove stale items from the BSP tree.
    bsp.removeItems(removedItems);
    // Purge this list.
    removedItems.clear();
    freeItemIndexes.clear();
    for (int i = 0; i < indexedItems.size(); ++i) {
        if (!indexedItems.at(i))
            freeItemIndexes << i;
    }
    purgePending = false;
}